

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv_test.cc
# Opt level: O2

void __thiscall
leveldb::MemEnvTest_OverwriteOpenFile_Test::TestBody(MemEnvTest_OverwriteOpenFile_Test *this)

{
  Env *pEVar1;
  Slice *pSVar2;
  int line;
  long *plVar3;
  char *pcVar4;
  Slice *this_00;
  Slice *message;
  AssertionResult gtest_ar_3;
  Slice local_c8;
  undefined1 local_b8 [8];
  Slice result;
  RandomAccessFile *rand_file;
  int local_84;
  char kWrite2Data [14];
  char scratch [13];
  string kTestFileName;
  char kWrite1Data [14];
  
  message = (Slice *)&gtest_ar_3;
  builtin_strncpy(kWrite1Data + 8," data",6);
  builtin_strncpy(kWrite1Data,"Write #1",8);
  testing::TempDir_abi_cxx11_();
  std::operator+(&kTestFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 "leveldb-TestFile.dat");
  std::__cxx11::string::_M_dispose();
  pEVar1 = (this->super_MemEnvTest).env_;
  gtest_ar_3._0_8_ = kWrite1Data;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )strlen(kWrite1Data);
  WriteStringToFile((leveldb *)&local_c8,pEVar1,(Slice *)&gtest_ar_3,&kTestFileName);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&result,kWrite2Data,
             (Status *)"WriteStringToFile(env_, kWrite1Data, kTestFileName)");
  Status::~Status((Status *)&local_c8);
  if ((char)result.data_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar_3);
    if (result.size_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)result.size_;
    }
    line = 0xc6;
LAB_0010e0c1:
    this_00 = &local_c8;
    pSVar2 = &result;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,line,pcVar4);
LAB_0010e0c9:
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    plVar3 = (long *)message->data_;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.size_);
    pEVar1 = (this->super_MemEnvTest).env_;
    (*pEVar1->_vptr_Env[3])(&gtest_ar_3,pEVar1,&kTestFileName,&rand_file);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&result,
               (char *)&local_c8,(Status *)"env_->NewRandomAccessFile(kTestFileName, &rand_file)");
    Status::~Status((Status *)&gtest_ar_3);
    if ((char)result.data_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (result.size_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)result.size_;
      }
      line = 0xc9;
      goto LAB_0010e0c1;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.size_);
    builtin_strncpy(kWrite2Data + 8," data",6);
    builtin_strncpy(kWrite2Data,"Write #2",8);
    pEVar1 = (this->super_MemEnvTest).env_;
    gtest_ar_3._0_8_ = kWrite2Data;
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )strlen(kWrite2Data);
    WriteStringToFile((leveldb *)&local_c8,pEVar1,(Slice *)&gtest_ar_3,&kTestFileName);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&result,scratch,
               (Status *)"WriteStringToFile(env_, kWrite2Data, kTestFileName)");
    Status::~Status((Status *)&local_c8);
    if ((char)result.data_ == '\0') {
      testing::Message::Message((Message *)&gtest_ar_3);
      if (result.size_ == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)result.size_;
      }
      line = 0xcc;
      goto LAB_0010e0c1;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&result.size_);
    pcVar4 = "";
    result.data_ = "";
    result.size_ = 0;
    (*rand_file->_vptr_RandomAccessFile[2])(&local_c8,rand_file,0,0xd,&result,scratch);
    testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
              ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)&gtest_ar_3,local_b8,
               (Status *)"rand_file->Read(0, kFileDataLen, &result, scratch)");
    Status::~Status((Status *)&local_c8);
    if (gtest_ar_3.success_ != false) {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_3.message_);
      local_b8._0_4_ = 0;
      local_c8.data_ = kWrite2Data;
      local_c8.size_ = strlen(kWrite2Data);
      local_84 = Slice::compare(&result,&local_c8);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_3,"0","result.compare(kWrite2Data)",(int *)local_b8,&local_84
                );
      if (gtest_ar_3.success_ != false) {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_3.message_);
        if (rand_file != (RandomAccessFile *)0x0) {
          (*rand_file->_vptr_RandomAccessFile[1])();
        }
        goto LAB_0010e0f2;
      }
      testing::Message::Message((Message *)&local_c8);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_3.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      pSVar2 = (Slice *)&gtest_ar_3;
      this_00 = (Slice *)local_b8;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
                 ,0xd3,pcVar4);
      message = &local_c8;
      goto LAB_0010e0c9;
    }
    testing::Message::Message((Message *)&local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_3.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = *(char **)gtest_ar_3.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    pSVar2 = (Slice *)&gtest_ar_3;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/helpers/memenv/memenv_test.cc"
               ,0xd2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_b8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_b8);
    plVar3 = (long *)local_c8.data_;
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pSVar2->size_);
LAB_0010e0f2:
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

TEST_F(MemEnvTest, OverwriteOpenFile) {
  const char kWrite1Data[] = "Write #1 data";
  const size_t kFileDataLen = sizeof(kWrite1Data) - 1;
  const std::string kTestFileName = testing::TempDir() + "leveldb-TestFile.dat";

  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite1Data, kTestFileName));

  RandomAccessFile* rand_file;
  ASSERT_LEVELDB_OK(env_->NewRandomAccessFile(kTestFileName, &rand_file));

  const char kWrite2Data[] = "Write #2 data";
  ASSERT_LEVELDB_OK(WriteStringToFile(env_, kWrite2Data, kTestFileName));

  // Verify that overwriting an open file will result in the new file data
  // being read from files opened before the write.
  Slice result;
  char scratch[kFileDataLen];
  ASSERT_LEVELDB_OK(rand_file->Read(0, kFileDataLen, &result, scratch));
  ASSERT_EQ(0, result.compare(kWrite2Data));

  delete rand_file;
}